

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O1

void end_pass(ftrl *g)

{
  vw *all;
  pointer pcVar1;
  bool bVar2;
  string local_40;
  
  all = g->all;
  if (all->holdout_set_off == false) {
    bVar2 = summarize_holdout_set(all,&g->no_win_counter);
    if (bVar2) {
      pcVar1 = (all->final_regressor_name)._M_dataplus._M_p;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar1,pcVar1 + (all->final_regressor_name)._M_string_length);
      finalize_regressor(all,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
    if ((g->early_stop_thres == g->no_win_counter) &&
       ((all->check_holdout_every_n_passes < 2 ||
        (all->current_pass % all->check_holdout_every_n_passes == 0)))) {
      set_done(all);
    }
  }
  return;
}

Assistant:

void end_pass(ftrl& g)
{
  vw& all = *g.all;

  if (!all.holdout_set_off)
  {
    if (summarize_holdout_set(all, g.no_win_counter))
      finalize_regressor(all, all.final_regressor_name);
    if ((g.early_stop_thres == g.no_win_counter) &&
        ((all.check_holdout_every_n_passes <= 1) || ((all.current_pass % all.check_holdout_every_n_passes) == 0)))
      set_done(all);
  }
}